

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

TIntermAggregate * __thiscall
glslang::TIntermediate::makeAggregate(TIntermediate *this,TIntermNode *node)

{
  int iVar1;
  TIntermAggregate *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermNode *local_18;
  
  if (node == (TIntermNode *)0x0) {
    this_00 = (TIntermAggregate *)0x0;
  }
  else {
    local_18 = node;
    this_00 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)node);
    TIntermAggregate::TIntermAggregate(this_00);
    iVar1 = (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])(this_00);
    std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
              ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
               CONCAT44(extraout_var,iVar1),&local_18);
    iVar1 = (**local_18->_vptr_TIntermNode)();
    (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
              (this_00,CONCAT44(extraout_var_00,iVar1));
  }
  return this_00;
}

Assistant:

TIntermAggregate* TIntermediate::makeAggregate(TIntermNode* node)
{
    if (node == nullptr)
        return nullptr;

    TIntermAggregate* aggNode = new TIntermAggregate;
    aggNode->getSequence().push_back(node);
    aggNode->setLoc(node->getLoc());

    return aggNode;
}